

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O1

void highbd_dr_prediction_32bit_z1_64xN_avx2
               (int N,uint16_t *dst,ptrdiff_t stride,uint16_t *above,int upsample_above,int dx)

{
  uint16_t uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  undefined1 auVar14 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar15 [32];
  
  if (0 < N) {
    uVar5 = N + 0x3f;
    uVar1 = above[(long)N + 0x3f];
    auVar14._2_2_ = uVar1;
    auVar14._0_2_ = uVar1;
    auVar14._4_2_ = uVar1;
    auVar14._6_2_ = uVar1;
    auVar14._8_2_ = uVar1;
    auVar14._10_2_ = uVar1;
    auVar14._12_2_ = uVar1;
    auVar14._14_2_ = uVar1;
    auVar15._16_2_ = uVar1;
    auVar15._0_16_ = auVar14;
    auVar15._18_2_ = uVar1;
    auVar15._20_2_ = uVar1;
    auVar15._22_2_ = uVar1;
    auVar15._24_2_ = uVar1;
    auVar15._26_2_ = uVar1;
    auVar15._28_2_ = uVar1;
    auVar15._30_2_ = uVar1;
    auVar16._0_2_ = (undefined2)uVar5;
    auVar16._2_2_ = auVar16._0_2_;
    auVar16._4_2_ = auVar16._0_2_;
    auVar16._6_2_ = auVar16._0_2_;
    auVar16._8_2_ = auVar16._0_2_;
    auVar16._10_2_ = auVar16._0_2_;
    auVar16._12_2_ = auVar16._0_2_;
    auVar16._14_2_ = auVar16._0_2_;
    auVar16._16_2_ = auVar16._0_2_;
    auVar16._18_2_ = auVar16._0_2_;
    auVar16._20_2_ = auVar16._0_2_;
    auVar16._22_2_ = auVar16._0_2_;
    auVar16._24_2_ = auVar16._0_2_;
    auVar16._26_2_ = auVar16._0_2_;
    auVar16._28_2_ = auVar16._0_2_;
    auVar16._30_2_ = auVar16._0_2_;
    auVar17._8_4_ = 0x10;
    auVar17._0_8_ = 0x1000000010;
    auVar17._12_4_ = 0x10;
    auVar17._16_4_ = 0x10;
    auVar17._20_4_ = 0x10;
    auVar17._24_4_ = 0x10;
    auVar17._28_4_ = 0x10;
    iVar11 = 0;
    auVar2 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
    iVar3 = N;
    uVar4 = upsample_above;
    do {
      iVar13 = (int)uVar4 >> 6;
      iVar8 = iVar3;
      if (iVar13 < (int)uVar5) {
        uVar6 = uVar4 >> 1;
        uVar7 = uVar6 & 0x1f;
        auVar18._0_8_ = CONCAT44(uVar6,uVar6) & 0x1f0000001f;
        auVar18._8_4_ = uVar7;
        auVar18._12_4_ = uVar7;
        auVar18._16_4_ = uVar7;
        auVar18._20_4_ = uVar7;
        auVar18._24_4_ = uVar7;
        auVar18._28_4_ = uVar7;
        lVar9 = (long)iVar13;
        lVar12 = (ulong)uVar5 - lVar9;
        uVar10 = 0xfffffffffffffff0;
        do {
          auVar19 = auVar15;
          if (0 < lVar12) {
            auVar22 = auVar14;
            if (8 < lVar12) {
              auVar19 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar9 + uVar10 + 0x18));
              auVar21 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar9 + uVar10 + 0x19));
              auVar21 = vpsubd_avx2(auVar21,auVar19);
              auVar19 = vpslld_avx2(auVar19,5);
              auVar21 = vpmulld_avx2(auVar21,auVar18);
              auVar19 = vpaddd_avx2(auVar19,auVar17);
              auVar19 = vpaddd_avx2(auVar21,auVar19);
              auVar19 = vpsrld_avx2(auVar19,5);
              auVar21._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar19._16_16_;
              auVar21._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar14
              ;
              auVar19 = vpackusdw_avx2(auVar19,auVar21);
              auVar22 = auVar19._0_16_;
            }
            auVar19 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar9 + uVar10 + 0x10));
            auVar21 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar9 + uVar10 + 0x11));
            auVar21 = vpsubd_avx2(auVar21,auVar19);
            auVar19 = vpslld_avx2(auVar19,5);
            auVar21 = vpmulld_avx2(auVar21,auVar18);
            auVar19 = vpaddd_avx2(auVar19,auVar17);
            auVar19 = vpaddd_avx2(auVar21,auVar19);
            auVar19 = vpsrld_avx2(auVar19,5);
            auVar19 = vpackusdw_avx2(auVar19,ZEXT1632(auVar19._16_16_));
            auVar20._0_16_ = ZEXT116(0) * auVar22 + ZEXT116(1) * auVar19._0_16_;
            auVar20._16_16_ = ZEXT116(0) * auVar19._16_16_ + ZEXT116(1) * auVar22;
            iVar8 = (int)uVar10;
            uVar6 = iVar13 + 0x10 + iVar8;
            auVar22._0_2_ = (undefined2)uVar6;
            auVar22._2_2_ = auVar22._0_2_;
            auVar22._4_2_ = auVar22._0_2_;
            auVar22._6_2_ = auVar22._0_2_;
            auVar22._8_2_ = auVar22._0_2_;
            auVar22._10_2_ = auVar22._0_2_;
            auVar22._12_2_ = auVar22._0_2_;
            auVar22._14_2_ = auVar22._0_2_;
            auVar22 = vpaddw_avx(auVar22,auVar2);
            auVar23 = vpslldq_avx(auVar22,2);
            auVar23 = vpblendw_avx(auVar23,ZEXT416(uVar6),1);
            auVar22 = vpsrldq_avx(auVar22,0xe);
            auVar19._0_16_ = ZEXT116(0) * auVar22 + ZEXT116(1) * auVar14;
            auVar19._16_16_ = ZEXT116(0) * auVar15._16_16_ + ZEXT116(1) * auVar22;
            auVar24._0_2_ = (undefined2)(iVar13 + 0x19 + iVar8);
            auVar24._2_2_ = auVar24._0_2_;
            auVar24._4_2_ = auVar24._0_2_;
            auVar24._6_2_ = auVar24._0_2_;
            auVar24._8_2_ = auVar24._0_2_;
            auVar24._10_2_ = auVar24._0_2_;
            auVar24._12_2_ = auVar24._0_2_;
            auVar24._14_2_ = auVar24._0_2_;
            auVar24._16_2_ = auVar24._0_2_;
            auVar24._18_2_ = auVar24._0_2_;
            auVar24._20_2_ = auVar24._0_2_;
            auVar24._22_2_ = auVar24._0_2_;
            auVar24._24_2_ = auVar24._0_2_;
            auVar24._26_2_ = auVar24._0_2_;
            auVar24._28_2_ = auVar24._0_2_;
            auVar24._30_2_ = auVar24._0_2_;
            auVar19 = vpblendw_avx2(auVar19,auVar24,2);
            auVar25._0_2_ = (undefined2)(iVar13 + 0x1a + iVar8);
            auVar25._2_2_ = auVar25._0_2_;
            auVar25._4_2_ = auVar25._0_2_;
            auVar25._6_2_ = auVar25._0_2_;
            auVar25._8_2_ = auVar25._0_2_;
            auVar25._10_2_ = auVar25._0_2_;
            auVar25._12_2_ = auVar25._0_2_;
            auVar25._14_2_ = auVar25._0_2_;
            auVar25._16_2_ = auVar25._0_2_;
            auVar25._18_2_ = auVar25._0_2_;
            auVar25._20_2_ = auVar25._0_2_;
            auVar25._22_2_ = auVar25._0_2_;
            auVar25._24_2_ = auVar25._0_2_;
            auVar25._26_2_ = auVar25._0_2_;
            auVar25._28_2_ = auVar25._0_2_;
            auVar25._30_2_ = auVar25._0_2_;
            auVar19 = vpblendw_avx2(auVar19,auVar25,4);
            auVar26._0_2_ = (undefined2)(iVar13 + 0x1b + iVar8);
            auVar26._2_2_ = auVar26._0_2_;
            auVar26._4_2_ = auVar26._0_2_;
            auVar26._6_2_ = auVar26._0_2_;
            auVar26._8_2_ = auVar26._0_2_;
            auVar26._10_2_ = auVar26._0_2_;
            auVar26._12_2_ = auVar26._0_2_;
            auVar26._14_2_ = auVar26._0_2_;
            auVar26._16_2_ = auVar26._0_2_;
            auVar26._18_2_ = auVar26._0_2_;
            auVar26._20_2_ = auVar26._0_2_;
            auVar26._22_2_ = auVar26._0_2_;
            auVar26._24_2_ = auVar26._0_2_;
            auVar26._26_2_ = auVar26._0_2_;
            auVar26._28_2_ = auVar26._0_2_;
            auVar26._30_2_ = auVar26._0_2_;
            auVar19 = vpblendw_avx2(auVar19,auVar26,8);
            auVar27._0_2_ = (undefined2)(iVar13 + 0x1c + iVar8);
            auVar27._2_2_ = auVar27._0_2_;
            auVar27._4_2_ = auVar27._0_2_;
            auVar27._6_2_ = auVar27._0_2_;
            auVar27._8_2_ = auVar27._0_2_;
            auVar27._10_2_ = auVar27._0_2_;
            auVar27._12_2_ = auVar27._0_2_;
            auVar27._14_2_ = auVar27._0_2_;
            auVar27._16_2_ = auVar27._0_2_;
            auVar27._18_2_ = auVar27._0_2_;
            auVar27._20_2_ = auVar27._0_2_;
            auVar27._22_2_ = auVar27._0_2_;
            auVar27._24_2_ = auVar27._0_2_;
            auVar27._26_2_ = auVar27._0_2_;
            auVar27._28_2_ = auVar27._0_2_;
            auVar27._30_2_ = auVar27._0_2_;
            auVar19 = vpblendw_avx2(auVar19,auVar27,0x10);
            auVar28._0_2_ = (undefined2)(iVar13 + 0x1d + iVar8);
            auVar28._2_2_ = auVar28._0_2_;
            auVar28._4_2_ = auVar28._0_2_;
            auVar28._6_2_ = auVar28._0_2_;
            auVar28._8_2_ = auVar28._0_2_;
            auVar28._10_2_ = auVar28._0_2_;
            auVar28._12_2_ = auVar28._0_2_;
            auVar28._14_2_ = auVar28._0_2_;
            auVar28._16_2_ = auVar28._0_2_;
            auVar28._18_2_ = auVar28._0_2_;
            auVar28._20_2_ = auVar28._0_2_;
            auVar28._22_2_ = auVar28._0_2_;
            auVar28._24_2_ = auVar28._0_2_;
            auVar28._26_2_ = auVar28._0_2_;
            auVar28._28_2_ = auVar28._0_2_;
            auVar28._30_2_ = auVar28._0_2_;
            auVar19 = vpblendw_avx2(auVar19,auVar28,0x20);
            auVar29._0_2_ = (undefined2)(iVar13 + 0x1e + iVar8);
            auVar29._2_2_ = auVar29._0_2_;
            auVar29._4_2_ = auVar29._0_2_;
            auVar29._6_2_ = auVar29._0_2_;
            auVar29._8_2_ = auVar29._0_2_;
            auVar29._10_2_ = auVar29._0_2_;
            auVar29._12_2_ = auVar29._0_2_;
            auVar29._14_2_ = auVar29._0_2_;
            auVar29._16_2_ = auVar29._0_2_;
            auVar29._18_2_ = auVar29._0_2_;
            auVar29._20_2_ = auVar29._0_2_;
            auVar29._22_2_ = auVar29._0_2_;
            auVar29._24_2_ = auVar29._0_2_;
            auVar29._26_2_ = auVar29._0_2_;
            auVar29._28_2_ = auVar29._0_2_;
            auVar29._30_2_ = auVar29._0_2_;
            auVar19 = vpblendw_avx2(auVar19,auVar29,0x40);
            auVar30._0_2_ = (undefined2)(iVar13 + 0x1f + iVar8);
            auVar30._2_2_ = auVar30._0_2_;
            auVar30._4_2_ = auVar30._0_2_;
            auVar30._6_2_ = auVar30._0_2_;
            auVar30._8_2_ = auVar30._0_2_;
            auVar30._10_2_ = auVar30._0_2_;
            auVar30._12_2_ = auVar30._0_2_;
            auVar30._14_2_ = auVar30._0_2_;
            auVar30._16_2_ = auVar30._0_2_;
            auVar30._18_2_ = auVar30._0_2_;
            auVar30._20_2_ = auVar30._0_2_;
            auVar30._22_2_ = auVar30._0_2_;
            auVar30._24_2_ = auVar30._0_2_;
            auVar30._26_2_ = auVar30._0_2_;
            auVar30._28_2_ = auVar30._0_2_;
            auVar30._30_2_ = auVar30._0_2_;
            auVar19 = vpblendw_avx2(auVar19,auVar30,0x80);
            auVar19 = vpblendd_avx2(ZEXT1632(auVar23),auVar19,0xf0);
            auVar19 = vpcmpgtw_avx2(auVar16,auVar19);
            auVar19 = vpblendvb_avx2(auVar15,auVar20,auVar19);
          }
          *(undefined1 (*) [32])((long)*(undefined1 (*) [32])((long)dst + 0x20) + uVar10 * 2) =
               auVar19;
          uVar10 = uVar10 + 0x10;
          lVar12 = lVar12 + -0x10;
        } while (uVar10 < 0x30);
        uVar4 = uVar4 + upsample_above;
      }
      else {
        do {
          *(undefined1 (*) [32])dst = auVar15;
          *(undefined1 (*) [32])((long)dst + 0x20) = auVar15;
          *(undefined1 (*) [32])((long)dst + 0x40) = auVar15;
          *(undefined1 (*) [32])((long)dst + 0x60) = auVar15;
          dst = (uint16_t *)((long)*(undefined1 (*) [32])dst + stride * 2);
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      if ((int)uVar5 <= iVar13) {
        return;
      }
      iVar11 = iVar11 + 1;
      iVar3 = iVar3 + -1;
      dst = (uint16_t *)((long)*(undefined1 (*) [32])dst + stride * 2);
    } while (iVar11 < N);
  }
  return;
}

Assistant:

static void highbd_dr_prediction_32bit_z1_64xN_avx2(int N, uint16_t *dst,
                                                    ptrdiff_t stride,
                                                    const uint16_t *above,
                                                    int upsample_above,
                                                    int dx) {
  // here upsample_above is 0 by design of av1_use_intra_edge_upsample
  (void)upsample_above;
  const int frac_bits = 6;
  const int max_base_x = ((64 + N) - 1);

  // pre-filter above pixels
  // store in temp buffers:
  //   above[x] * 32 + 16
  //   above[x+1] - above[x]
  // final pixels will be calculated as:
  //   (above[x] * 32 + 16 + (above[x+1] - above[x]) * shift) >> 5
  __m256i a0, a0_1, a1, a1_1, a32, a16;
  __m256i a_mbase_x, diff, max_base_x256, base_inc256, mask256;

  a16 = _mm256_set1_epi32(16);
  a_mbase_x = _mm256_set1_epi16(above[max_base_x]);
  max_base_x256 = _mm256_set1_epi16(max_base_x);

  int x = dx;
  for (int r = 0; r < N; r++, dst += stride) {
    __m256i b, res[2], res1;

    int base = x >> frac_bits;
    if (base >= max_base_x) {
      for (int i = r; i < N; ++i) {
        _mm256_storeu_si256((__m256i *)dst, a_mbase_x);  // save 32 values
        _mm256_storeu_si256((__m256i *)(dst + 16), a_mbase_x);
        _mm256_storeu_si256((__m256i *)(dst + 32), a_mbase_x);
        _mm256_storeu_si256((__m256i *)(dst + 48), a_mbase_x);
        dst += stride;
      }
      return;
    }

    __m256i shift = _mm256_srli_epi32(
        _mm256_and_si256(_mm256_set1_epi32(x), _mm256_set1_epi32(0x3f)), 1);

    __m128i a0_128, a0_1_128, a1_128, a1_1_128;
    for (int j = 0; j < 64; j += 16) {
      int mdif = max_base_x - (base + j);
      if (mdif <= 0) {
        _mm256_storeu_si256((__m256i *)(dst + j), a_mbase_x);
      } else {
        a0_128 = _mm_loadu_si128((__m128i *)(above + base + j));
        a1_128 = _mm_loadu_si128((__m128i *)(above + base + 1 + j));
        a0 = _mm256_cvtepu16_epi32(a0_128);
        a1 = _mm256_cvtepu16_epi32(a1_128);

        diff = _mm256_sub_epi32(a1, a0);   // a[x+1] - a[x]
        a32 = _mm256_slli_epi32(a0, 5);    // a[x] * 32
        a32 = _mm256_add_epi32(a32, a16);  // a[x] * 32 + 16
        b = _mm256_mullo_epi32(diff, shift);

        res[0] = _mm256_add_epi32(a32, b);
        res[0] = _mm256_srli_epi32(res[0], 5);
        res[0] = _mm256_packus_epi32(
            res[0],
            _mm256_castsi128_si256(_mm256_extracti128_si256(res[0], 1)));
        if (mdif > 8) {
          a0_1_128 = _mm_loadu_si128((__m128i *)(above + base + 8 + j));
          a1_1_128 = _mm_loadu_si128((__m128i *)(above + base + 9 + j));
          a0_1 = _mm256_cvtepu16_epi32(a0_1_128);
          a1_1 = _mm256_cvtepu16_epi32(a1_1_128);

          diff = _mm256_sub_epi32(a1_1, a0_1);  // a[x+1] - a[x]
          a32 = _mm256_slli_epi32(a0_1, 5);     // a[x] * 32
          a32 = _mm256_add_epi32(a32, a16);     // a[x] * 32 + 16
          b = _mm256_mullo_epi32(diff, shift);

          res[1] = _mm256_add_epi32(a32, b);
          res[1] = _mm256_srli_epi32(res[1], 5);
          res[1] = _mm256_packus_epi32(
              res[1],
              _mm256_castsi128_si256(_mm256_extracti128_si256(res[1], 1)));
        } else {
          res[1] = a_mbase_x;
        }
        res1 = _mm256_inserti128_si256(res[0], _mm256_castsi256_si128(res[1]),
                                       1);  // 16 16bit values
        base_inc256 = _mm256_setr_epi16(
            base + j, base + j + 1, base + j + 2, base + j + 3, base + j + 4,
            base + j + 5, base + j + 6, base + j + 7, base + j + 8,
            base + j + 9, base + j + 10, base + j + 11, base + j + 12,
            base + j + 13, base + j + 14, base + j + 15);

        mask256 = _mm256_cmpgt_epi16(max_base_x256, base_inc256);
        res1 = _mm256_blendv_epi8(a_mbase_x, res1, mask256);
        _mm256_storeu_si256((__m256i *)(dst + j), res1);
      }
    }
    x += dx;
  }
}